

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickpool.hpp
# Opt level: O3

void __thiscall quickpool::sched::TaskManager::wait_for_jobs(TaskManager *this,size_t id)

{
  relaxed_atomic<unsigned_long> *prVar1;
  __int_type_conflict _Var2;
  int iVar3;
  void *pvVar4;
  
  pvVar4 = (void *)id;
  if ((this->status_).super_atomic<quickpool::sched::TaskManager::Status>._M_i == errored) {
    iVar3 = pthread_mutex_lock((pthread_mutex_t *)&this->mtx_);
    if (iVar3 != 0) {
      std::__throw_system_error(iVar3);
    }
    LOCK();
    prVar1 = &this->num_waiting_;
    _Var2 = (prVar1->super_atomic<unsigned_long,_64UL>).super_atomic<unsigned_long>.
            super___atomic_base<unsigned_long>._M_i;
    (prVar1->super_atomic<unsigned_long,_64UL>).super_atomic<unsigned_long>.
    super___atomic_base<unsigned_long>._M_i =
         (prVar1->super_atomic<unsigned_long,_64UL>).super_atomic<unsigned_long>.
         super___atomic_base<unsigned_long>._M_i + 1;
    UNLOCK();
    if (_Var2 + 1 ==
        (long)(this->queues_).
              super__Vector_base<quickpool::sched::TaskQueue,_quickpool::mem::aligned::allocator<quickpool::sched::TaskQueue,_64UL>_>
              ._M_impl.super__Vector_impl_data._M_finish -
        (long)(this->queues_).
              super__Vector_base<quickpool::sched::TaskQueue,_quickpool::mem::aligned::allocator<quickpool::sched::TaskQueue,_64UL>_>
              ._M_impl.super__Vector_impl_data._M_start >> 8) {
      std::condition_variable::notify_all();
    }
    pthread_mutex_unlock((pthread_mutex_t *)&this->mtx_);
  }
  else {
    LOCK();
    (this->num_waiting_).super_atomic<unsigned_long,_64UL>.super_atomic<unsigned_long>.
    super___atomic_base<unsigned_long>._M_i =
         (this->num_waiting_).super_atomic<unsigned_long,_64UL>.super_atomic<unsigned_long>.
         super___atomic_base<unsigned_long>._M_i + 1;
    UNLOCK();
  }
  TaskQueue::wait((this->queues_).
                  super__Vector_base<quickpool::sched::TaskQueue,_quickpool::mem::aligned::allocator<quickpool::sched::TaskQueue,_64UL>_>
                  ._M_impl.super__Vector_impl_data._M_start + id,pvVar4);
  LOCK();
  (this->num_waiting_).super_atomic<unsigned_long,_64UL>.super_atomic<unsigned_long>.
  super___atomic_base<unsigned_long>._M_i =
       (this->num_waiting_).super_atomic<unsigned_long,_64UL>.super_atomic<unsigned_long>.
       super___atomic_base<unsigned_long>._M_i - 1;
  UNLOCK();
  return;
}

Assistant:

void wait_for_jobs(size_t id)
    {
        if (has_errored()) {
            // Main thread may be waiting to reset the pool.
            std::lock_guard<std::mutex> lk(mtx_);
            if (++num_waiting_ == queues_.size())
                cv_.notify_all();
        } else {
            ++num_waiting_;
        }

        queues_[id].wait();
        --num_waiting_;
    }